

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

int * LoadRandomSequence(uint count,int min,int max)

{
  uint32_t uVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  iVar4 = max - min;
  iVar6 = -iVar4;
  if (0 < iVar4) {
    iVar6 = iVar4;
  }
  if (iVar6 + 1U < count) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)calloc((ulong)count,4);
    if (count != 0) {
      uVar5 = 0;
      do {
        uVar1 = rprand_xoshiro();
        iVar4 = uVar1 % (iVar6 + 1U) + min;
        if ((int)uVar5 != 0) {
          uVar3 = 0;
          do {
            if (piVar2[uVar3] == iVar4) goto LAB_0016e53d;
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        piVar2[uVar5] = iVar4;
        uVar5 = (ulong)((int)uVar5 + 1);
LAB_0016e53d:
      } while ((uint)uVar5 < count);
    }
  }
  return piVar2;
}

Assistant:

int *LoadRandomSequence(unsigned int count, int min, int max)
{
    int *values = NULL;

#if defined(SUPPORT_RPRAND_GENERATOR)
    values = rprand_load_sequence(count, min, max);
#else
    if (count > ((unsigned int)abs(max - min) + 1)) return values;  // Security check

    values = (int *)RL_CALLOC(count, sizeof(int));

    int value = 0;
    bool dupValue = false;

    for (int i = 0; i < (int)count;)
    {
        value = (rand()%(abs(max - min) + 1) + min);
        dupValue = false;

        for (int j = 0; j < i; j++)
        {
            if (values[j] == value)
            {
                dupValue = true;
                break;
            }
        }

        if (!dupValue)
        {
            values[i] = value;
            i++;
        }
    }
#endif
    return values;
}